

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

const_iterator __thiscall
minibag::Bag::checkField
          (Bag *this,M_string *fields,string *field,uint min_len,uint max_len,bool required)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ostream *poVar5;
  string *msg;
  uint in_ECX;
  string *in_RDX;
  uint in_R8D;
  byte in_R9B;
  stringstream ss;
  const_iterator fitr;
  string *in_stack_fffffffffffffd98;
  BagFormatException *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  stringstream local_210 [16];
  ostream local_200 [379];
  undefined1 local_85;
  _Self local_38;
  byte local_29;
  uint local_28;
  uint local_24;
  string *local_20;
  _Self local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffd98,(key_type *)0x166baf);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffd98);
  bVar1 = std::operator==(&local_8,&local_38);
  if (!bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x166d0b);
    uVar4 = std::__cxx11::string::size();
    if (local_24 <= uVar4) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x166d30);
      uVar4 = std::__cxx11::string::size();
      if (uVar4 <= local_28) {
        return (const_iterator)local_8._M_node;
      }
    }
    std::__cxx11::stringstream::stringstream(local_210);
    poVar5 = std::operator<<(local_200,"Field \'");
    poVar5 = std::operator<<(poVar5,local_20);
    poVar5 = std::operator<<(poVar5," is wrong size (");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x166dac);
    uVar2 = std::__cxx11::string::size();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    std::operator<<(poVar5," bytes)");
    msg = (string *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    BagFormatException::BagFormatException((BagFormatException *)poVar5,msg);
    __cxa_throw(msg,&BagFormatException::typeinfo,BagFormatException::~BagFormatException);
  }
  if ((local_29 & 1) == 0) {
    return (const_iterator)local_8._M_node;
  }
  local_85 = 1;
  uVar3 = __cxa_allocate_exception(0x10);
  std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
  BagFormatException::BagFormatException(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_85 = 0;
  __cxa_throw(uVar3,&BagFormatException::typeinfo,BagFormatException::~BagFormatException);
}

Assistant:

M_string::const_iterator Bag::checkField(M_string const& fields, string const& field, unsigned int min_len, unsigned int max_len, bool required) const {
    M_string::const_iterator fitr = fields.find(field);
    if (fitr == fields.end()) {
        if (required)
            throw BagFormatException("Required '" + field + "' field missing");
    }
    else if ((fitr->second.size() < min_len) || (fitr->second.size() > max_len))
    {
        std::stringstream ss;
        ss << "Field '" << field << " is wrong size (" << (uint32_t) fitr->second.size() << " bytes)";
        throw BagFormatException(ss.str());
    }

    return fitr;
}